

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O0

bool __thiscall AABox::intersect(AABox *this,Ray *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool local_21;
  float tmax;
  float tmin;
  Ray *r_local;
  AABox *this_local;
  
  if ((r->dir).x <= 0.0) {
    tmin = (this->x2 - (r->origin).x) / (r->dir).x;
    tmax = (this->x1 - (r->origin).x) / (r->dir).x;
  }
  else {
    tmin = (this->x1 - (r->origin).x) / (r->dir).x;
    tmax = (this->x2 - (r->origin).x) / (r->dir).x;
  }
  if ((r->dir).y <= 0.0) {
    dVar3 = (double)tmin;
    dVar2 = (double)((this->y2 - (r->origin).y) / (r->dir).y);
    dVar1 = dVar2;
    if (dVar2 <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar1 | -(ulong)NAN(dVar3) & (ulong)dVar2);
    dVar4 = (double)tmax;
    dVar2 = (double)((this->y1 - (r->origin).y) / (r->dir).y);
    dVar1 = dVar2;
    if (dVar4 <= dVar2) {
      dVar1 = dVar4;
    }
    dVar2 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar1 | -(ulong)NAN(dVar4) & (ulong)dVar2);
  }
  else {
    dVar3 = (double)tmin;
    dVar2 = (double)((this->y1 - (r->origin).y) / (r->dir).y);
    dVar1 = dVar2;
    if (dVar2 <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar1 | -(ulong)NAN(dVar3) & (ulong)dVar2);
    dVar4 = (double)tmax;
    dVar2 = (double)((this->y2 - (r->origin).y) / (r->dir).y);
    dVar1 = dVar2;
    if (dVar4 <= dVar2) {
      dVar1 = dVar4;
    }
    dVar2 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar1 | -(ulong)NAN(dVar4) & (ulong)dVar2);
  }
  tmin = (float)dVar3;
  tmax = (float)dVar2;
  if ((r->dir).z <= 0.0) {
    dVar3 = (double)tmin;
    dVar2 = (double)((this->z2 - (r->origin).z) / (r->dir).z);
    dVar1 = dVar2;
    if (dVar2 <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar1 | -(ulong)NAN(dVar3) & (ulong)dVar2);
    dVar4 = (double)tmax;
    dVar2 = (double)((this->z1 - (r->origin).z) / (r->dir).z);
    dVar1 = dVar2;
    if (dVar4 <= dVar2) {
      dVar1 = dVar4;
    }
    dVar2 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar1 | -(ulong)NAN(dVar4) & (ulong)dVar2);
  }
  else {
    dVar3 = (double)tmin;
    dVar2 = (double)((this->z1 - (r->origin).z) / (r->dir).z);
    dVar1 = dVar2;
    if (dVar2 <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar1 | -(ulong)NAN(dVar3) & (ulong)dVar2);
    dVar4 = (double)tmax;
    dVar2 = (double)((this->z2 - (r->origin).z) / (r->dir).z);
    dVar1 = dVar2;
    if (dVar4 <= dVar2) {
      dVar1 = dVar4;
    }
    dVar2 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar1 | -(ulong)NAN(dVar4) & (ulong)dVar2);
  }
  tmin = (float)dVar3;
  tmax = (float)dVar2;
  local_21 = tmin <= tmax && 0.0 < tmax;
  return local_21;
}

Assistant:

bool intersect(const Ray& r)
	{
		float tmin, tmax;
		if (r.dir.x > 0)
			tmin = (x1 - r.origin.x) / r.dir.x,
			tmax = (x2 - r.origin.x) / r.dir.x;
		else
			tmin = (x2 - r.origin.x) / r.dir.x,
			tmax = (x1 - r.origin.x) / r.dir.x;
		if (r.dir.y > 0)
			tmin = fmax(tmin, (y1 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y2 - r.origin.y) / r.dir.y);
		else
			tmin = fmax(tmin, (y2 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y1 - r.origin.y) / r.dir.y);
		if (r.dir.z > 0)
			tmin = fmax(tmin, (z1 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z2 - r.origin.z) / r.dir.z);
		else
			tmin = fmax(tmin, (z2 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z1 - r.origin.z) / r.dir.z);
		return tmin <= tmax && tmax > 0;
	}